

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::piece_finished_alert::~piece_finished_alert(piece_finished_alert *this)

{
  piece_finished_alert *this_local;
  
  torrent_alert::~torrent_alert(&this->super_torrent_alert);
  return;
}

Assistant:

struct TORRENT_EXPORT piece_finished_alert final : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT piece_finished_alert(aux::stack_allocator& alloc,
			torrent_handle const& h, piece_index_t piece_num);

		TORRENT_DEFINE_ALERT(piece_finished_alert, 27)

#include "libtorrent/aux_/disable_deprecation_warnings_push.hpp"

		static inline constexpr alert_category_t static_category =
			alert_category::piece_progress
			PROGRESS_NOTIFICATION
		;
#include "libtorrent/aux_/disable_warnings_pop.hpp"

		std::string message() const override;

		// the index of the piece that finished
		piece_index_t const piece_index;
	}